

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O3

void Sle_ManMarkupVariables(Sle_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  pGVar3 = p->pGia;
  iVar7 = pGVar3->nObjs;
  p->nNodeVars = iVar7;
  iVar5 = iVar7;
  if (iVar7 < 1) {
    p->nCutVars = 0;
    iVar8 = 0;
  }
  else {
    pGVar9 = pGVar3->pObjs;
    lVar10 = 0;
    iVar6 = iVar7;
    do {
      if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar9) {
        if (p->vCutFirst->nSize <= lVar10) goto LAB_007aa7bb;
        p->vCutFirst->pArray[lVar10] = iVar5;
        uVar1 = p->vCuts->nSize;
        if ((int)uVar1 <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar4 = p->vCuts->pArray;
        uVar2 = piVar4[lVar10];
        if (((long)(int)uVar2 < 0) || (uVar1 <= uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar5 = iVar5 + piVar4[(int)uVar2];
        iVar6 = pGVar3->nObjs;
      }
      lVar10 = lVar10 + 1;
      pGVar9 = pGVar9 + 1;
    } while (lVar10 < iVar6);
    iVar7 = p->nNodeVars;
    iVar8 = iVar5 - iVar7;
    p->nCutVars = iVar8;
    if (0 < iVar6) {
      pGVar9 = pGVar3->pObjs;
      lVar10 = 4;
      lVar12 = 0;
      do {
        if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar9) {
          if (p->vEdgeFirst->nSize <= lVar12) goto LAB_007aa7bb;
          p->vEdgeFirst->pArray[lVar12] = iVar5;
          if (p->vCutFanins->nSize <= lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          iVar5 = iVar5 + *(int *)((long)&p->vCutFanins->pArray->nCap + lVar10);
          iVar6 = pGVar3->nObjs;
        }
        lVar12 = lVar12 + 1;
        pGVar9 = pGVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar12 < iVar6);
      iVar7 = p->nNodeVars;
      iVar8 = p->nCutVars;
      iVar11 = (iVar5 - iVar8) - iVar7;
      p->nEdgeVars = iVar11;
      if (0 < iVar6) {
        pGVar9 = pGVar3->pObjs;
        lVar10 = 0;
        do {
          if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar9) {
            if (p->vDelayFirst->nSize <= lVar10) {
LAB_007aa7bb:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            p->vDelayFirst->pArray[lVar10] = iVar5;
            iVar5 = iVar5 + p->nLevels;
            iVar6 = pGVar3->nObjs;
          }
          lVar10 = lVar10 + 1;
          pGVar9 = pGVar9 + 1;
        } while (lVar10 < iVar6);
        iVar11 = p->nEdgeVars;
        iVar7 = p->nNodeVars;
        iVar8 = p->nCutVars;
      }
      goto LAB_007aa7a8;
    }
  }
  iVar11 = (iVar5 - iVar8) - iVar7;
  p->nEdgeVars = iVar11;
LAB_007aa7a8:
  p->nDelayVars = iVar5 - (iVar7 + iVar8 + iVar11);
  p->nVarsTotal = iVar5;
  return;
}

Assistant:

void Sle_ManMarkupVariables( Sle_Man_t * p )
{
    int iObj, Counter = Gia_ManObjNum(p->pGia);
    // node variables
    p->nNodeVars = Counter;
    // cut variables
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_IntWriteEntry( p->vCutFirst, iObj, Counter );
        Counter += Sle_ListCutNum( Sle_ManList(p, iObj) );
    }
    p->nCutVars = Counter - p->nNodeVars;
    // edge variables
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_IntWriteEntry( p->vEdgeFirst, iObj, Counter );
        Counter += Vec_IntSize( Vec_WecEntry(p->vCutFanins, iObj) );
    }
    p->nEdgeVars = Counter - p->nCutVars - p->nNodeVars;
    // delay variables
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_IntWriteEntry( p->vDelayFirst, iObj, Counter );
        Counter += p->nLevels;
    }
    p->nDelayVars = Counter - p->nEdgeVars - p->nCutVars - p->nNodeVars;
    p->nVarsTotal = Counter;
}